

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelTransformers.cpp
# Opt level: O2

void iDynTree::computeTransformToTraversalBaseWithAdditionalTransform
               (Model *fullModel,Traversal *subModelTraversal,JointPosDoubleArray *jointPos,
               LinkPositions *traversalBase_H_link,
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform>_>_>
               *newLink_H_oldLink)

{
  uint uVar1;
  Link *this;
  Link *this_00;
  IJoint *pIVar2;
  LinkIndex LVar3;
  Transform *pTVar4;
  LinkIndex LVar5;
  const_iterator cVar6;
  ulong traversalIndex;
  string *psVar7;
  string local_90 [3];
  
  traversalIndex = 0;
  do {
    uVar1 = Traversal::getNrOfVisitedLinks(subModelTraversal);
    if (uVar1 <= traversalIndex) {
      return;
    }
    this = Traversal::getLink(subModelTraversal,traversalIndex);
    this_00 = Traversal::getParentLink(subModelTraversal,traversalIndex);
    pIVar2 = Traversal::getParentJoint(subModelTraversal,traversalIndex);
    if (this_00 == (Link *)0x0) {
      LVar3 = Link::getIndex(this);
      Model::getLinkName_abi_cxx11_(local_90,fullModel,LVar3);
      cVar6 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&newLink_H_oldLink->_M_h,local_90);
      std::__cxx11::string::~string((string *)local_90);
      if (cVar6.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform>,_true>
          ._M_cur == (__node_type *)0x0) {
        iDynTree::Transform::Identity();
        LVar3 = Link::getIndex(this);
        goto LAB_001b3efb;
      }
      psVar7 = (string *)
               ((long)cVar6.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::Transform>,_true>
                      ._M_cur + 0x28);
      LVar3 = Link::getIndex(this);
      pTVar4 = LinkPositions::operator()(traversalBase_H_link,LVar3);
    }
    else {
      LVar3 = Link::getIndex(this_00);
      pTVar4 = LinkPositions::operator()(traversalBase_H_link,LVar3);
      LVar3 = Link::getIndex(this_00);
      LVar5 = Link::getIndex(this);
      (*pIVar2->_vptr_IJoint[10])(pIVar2,jointPos,LVar3,LVar5);
      iDynTree::Transform::operator*((Transform *)local_90,pTVar4);
      LVar3 = Link::getIndex(this);
LAB_001b3efb:
      psVar7 = local_90;
      pTVar4 = LinkPositions::operator()(traversalBase_H_link,LVar3);
    }
    iDynTree::Transform::operator=(pTVar4,(Transform *)psVar7);
    traversalIndex = traversalIndex + 1;
  } while( true );
}

Assistant:

void computeTransformToTraversalBaseWithAdditionalTransform(const Model& fullModel,
                                                            const Traversal& subModelTraversal,
                                                            const JointPosDoubleArray& jointPos,
                                                                  LinkPositions& traversalBase_H_link,
                                                            const std::unordered_map<std::string, iDynTree::Transform>& newLink_H_oldLink)
{
    for(unsigned int traversalEl=0; traversalEl < subModelTraversal.getNrOfVisitedLinks(); traversalEl++)
    {
        LinkConstPtr visitedLink = subModelTraversal.getLink(traversalEl);
        LinkConstPtr parentLink  = subModelTraversal.getParentLink(traversalEl);
        IJointConstPtr toParentJoint = subModelTraversal.getParentJoint(traversalEl);

        // If this is the traversal base
        if( parentLink == 0 )
        {
            // If the visited link is the base, the base has no parent.
            // In this case the position of the base with respect to the base is simply
            // an identity transform, or a given transform if the link is in newLink_H_oldLink
            auto it = newLink_H_oldLink.find(fullModel.getLinkName(visitedLink->getIndex()));

            if (it != newLink_H_oldLink.end())
            {
                traversalBase_H_link(visitedLink->getIndex()) = it->second;
            }
            else
            {
                traversalBase_H_link(visitedLink->getIndex()) = iDynTree::Transform::Identity();
            }
        }
        else
        {
            // Otherwise we compute the world_H_link transform as:
            // world_H_link = world_H_parentLink * parentLink_H_link
            traversalBase_H_link(visitedLink->getIndex()) =
                traversalBase_H_link(parentLink->getIndex())*
                    toParentJoint->getTransform(jointPos,parentLink->getIndex(),visitedLink->getIndex());
        }
    }

    return;
}